

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slot.hpp
# Opt level: O2

Slot<void_(int),_std::function<void_(int)>_> * __thiscall
sig::Slot<void(int),std::function<void(int)>>::
track<void(),sig::Optional_last_value<void>,int,std::less<int>,std::function<void()>,std::mutex>
          (Slot<void(int),std::function<void(int)>> *this,
          Signal<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>
          *sig)

{
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_40;
  __weak_ptr<void,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sig::Signal_impl<void(),sig::Optional_last_value<void>,int,std::less<int>,std::function<void()>,std::mutex>,void>
            ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (__shared_ptr<sig::Signal_impl<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
              *)sig);
  std::__weak_ptr<void,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<void,void>(local_30,&local_40);
  std::vector<std::weak_ptr<void>,std::allocator<std::weak_ptr<void>>>::
  emplace_back<std::weak_ptr<void>>
            ((vector<std::weak_ptr<void>,std::allocator<std::weak_ptr<void>>> *)(this + 8),
             (weak_ptr<void> *)local_30);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return (Slot<void_(int),_std::function<void_(int)>_> *)this;
}

Assistant:

Slot& track(const Signal<T, U, V, W, X, Y>& sig) {
        tracked_ptrs_.push_back(sig.lock_impl_as_void());
        return *this;
    }